

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_cremate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int iVar1;
  CHAR_DATA *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  undefined4 in_R8D;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  CHAR_DATA *in_stack_00000008;
  int dam;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  CHAR_DATA *pCVar2;
  
  pCVar2 = in_RCX;
  iVar1 = dice(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
      (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
  saves_spell((int)victim,in_stack_00000008,unaff_retaddr_00);
  damage_old((CHAR_DATA *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
             (CHAR_DATA *)CONCAT44(in_EDI,in_ESI),(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
             (int)((ulong)pCVar2 >> 0x20),SUB81((ulong)pCVar2 >> 0x18,0));
  return;
}

Assistant:

void spell_cremate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;

	dam = dice(level, 7);

	act("$n is engulfed in raging fire!", victim, 0, 0, TO_ROOM);
	send_to_char("You are engulfed in raging fire!\n\r", victim);

	if (saves_spell(level, victim, DAM_FIRE))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_FIRE, true);
}